

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool IsValidSubDEdge(ON_SubDEdge *edge,unsigned_short level,uint *edge_id_range,bool bSilentError)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *pOVar3;
  ON_SubDVertex *vertex;
  ON_SubDVertex *pOStack_48;
  uint i;
  ON_SubDVertex *edge_vertex [2];
  ON_Internal_DamagedMarker dm;
  bool bSilentError_local;
  uint *edge_id_range_local;
  unsigned_short level_local;
  ON_SubDEdge *edge_local;
  
  if (edge == (ON_SubDEdge *)0x0) {
    bVar1 = ON_SubDIsNotValid(bSilentError);
    return bVar1;
  }
  uVar2 = ON_SubDComponentBase::SubdivisionLevel(&edge->super_ON_SubDComponentBase);
  if (uVar2 != level) {
    bVar1 = ON_SubDIsNotValid(bSilentError);
    return bVar1;
  }
  if (edge_id_range != (uint *)0x0) {
    if ((edge->super_ON_SubDComponentBase).m_id < *edge_id_range) {
      bVar1 = ON_SubDIsNotValid(bSilentError);
      return bVar1;
    }
    if (edge_id_range[1] < (edge->super_ON_SubDComponentBase).m_id) {
      bVar1 = ON_SubDIsNotValid(bSilentError);
      return bVar1;
    }
  }
  ON_Internal_DamagedMarker::ON_Internal_DamagedMarker
            ((ON_Internal_DamagedMarker *)(edge_vertex + 1),&edge->super_ON_SubDComponentBase);
  memset(&stack0xffffffffffffffb8,0,0x10);
  for (vertex._4_4_ = 0; vertex._4_4_ < 2; vertex._4_4_ = vertex._4_4_ + 1) {
    pOVar3 = ON_SubDEdge::Vertex(edge,vertex._4_4_);
    if (pOVar3 == (ON_SubDVertex *)0x0) {
      edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
      goto LAB_008797a8;
    }
    *(ON_SubDVertex **)((long)&stack0xffffffffffffffb8 + (ulong)vertex._4_4_ * 8) = pOVar3;
  }
  if (pOStack_48 == edge_vertex[0]) {
    edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  else {
    bVar1 = ON_SubDEdge::IsSmooth(edge);
    if (bVar1) {
      if (edge->m_face_count != 2) {
        edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        goto LAB_008797a8;
      }
    }
    else if (edge->m_edge_tag != Crease) {
      edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
      goto LAB_008797a8;
    }
    if ((edge->m_face_count < 3) || (edge->m_facex != (ON_SubDFacePtr *)0x0)) {
      ON_Internal_DamagedMarker::ClearComponent((ON_Internal_DamagedMarker *)(edge_vertex + 1));
      edge_local._7_1_ = true;
    }
    else {
      edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
    }
  }
LAB_008797a8:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker
            ((ON_Internal_DamagedMarker *)(edge_vertex + 1));
  return edge_local._7_1_;
}

Assistant:

static bool IsValidSubDEdge(
  const ON_SubDEdge* edge,
  unsigned short level,
  unsigned int* edge_id_range,
  bool bSilentError
  )
{
  if (nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr != edge_id_range)
  {
    if (edge->m_id < edge_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (edge->m_id > edge_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(edge);

  const ON_SubDVertex* edge_vertex[2] = {};
  for (unsigned int i = 0; i < 2; i++)
  {
    const ON_SubDVertex* vertex = edge->Vertex(i);
    if (nullptr == vertex)
      return ON_SubDIsNotValid(bSilentError);
    edge_vertex[i] = vertex;
  }
  if (edge_vertex[0] == edge_vertex[1])
    return ON_SubDIsNotValid(bSilentError);

  if (edge->IsSmooth())
  {
    // m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if ( 2 != edge->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }
  else if (ON_SubDEdgeTag::Crease != edge->m_edge_tag)
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  if (edge->m_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  dm.ClearComponent();

  return true;
}